

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  int iVar1;
  Arena *pAVar2;
  Extension *pEVar3;
  string *this_00;
  Rep *pRVar4;
  string *psVar5;
  int iVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  
  pVar7 = Insert(this,number);
  pEVar3 = pVar7.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    this_00 = (string *)(pEVar3->field_0).repeated_string_value;
  }
  else {
    pEVar3->type = type;
    pEVar3->is_repeated = true;
    pEVar3->is_packed = false;
    pAVar2 = this->arena_;
    if (pAVar2 == (Arena *)0x0) {
      this_00 = (string *)operator_new(0x18);
      (this_00->_M_dataplus)._M_p = (pointer)0x0;
      this_00->_M_string_length = 0;
      (this_00->field_2)._M_allocated_capacity = 0;
    }
    else {
      if (pAVar2->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation
                  (pAVar2,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
      }
      this_00 = (string *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (&pAVar2->impl_,0x18,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                          );
      (this_00->_M_dataplus)._M_p = (pointer)pAVar2;
      this_00->_M_string_length = 0;
      (this_00->field_2)._M_allocated_capacity = 0;
    }
    (pEVar3->field_0).string_value = this_00;
  }
  pRVar4 = (Rep *)(this_00->field_2)._M_allocated_capacity;
  if (pRVar4 == (Rep *)0x0) {
    iVar6 = *(int *)((long)&this_00->_M_string_length + 4);
  }
  else {
    iVar1 = (int)this_00->_M_string_length;
    iVar6 = pRVar4->allocated_size;
    if (iVar1 < iVar6) {
      *(int *)&this_00->_M_string_length = iVar1 + 1;
      return (string *)pRVar4->elements[iVar1];
    }
    if (iVar6 != *(int *)((long)&this_00->_M_string_length + 4)) goto LAB_002b846d;
  }
  RepeatedPtrFieldBase::Reserve((RepeatedPtrFieldBase *)this_00,iVar6 + 1);
  pRVar4 = (Rep *)(this_00->field_2)._M_allocated_capacity;
  iVar6 = pRVar4->allocated_size;
LAB_002b846d:
  pRVar4->allocated_size = iVar6 + 1;
  pAVar2 = (Arena *)(this_00->_M_dataplus)._M_p;
  if (pAVar2 == (Arena *)0x0) {
    psVar5 = (string *)operator_new(0x20);
  }
  else {
    if (pAVar2->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(pAVar2,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    psVar5 = (string *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       ((ArenaImpl *)pAVar2,0x20,arena_destruct_object<std::__cxx11::string>);
  }
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar5->_M_string_length = 0;
  (psVar5->field_2)._M_local_buf[0] = '\0';
  iVar6 = (int)this_00->_M_string_length;
  *(int *)&this_00->_M_string_length = iVar6 + 1;
  ((Rep *)(this_00->field_2)._M_allocated_capacity)->elements[iVar6] = psVar5;
  return psVar5;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->repeated_string_value->Add();
}